

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

string * __thiscall
Jupiter::Socket::ntop6_abi_cxx11_(string *__return_storage_ptr__,Socket *this,in6_addr ip)

{
  char *pcVar1;
  allocator<char> local_21;
  Socket *local_20;
  in6_addr ip_local;
  
  ip_local.__in6_u._0_8_ = ip.__in6_u._0_8_;
  local_20 = this;
  ip_local.__in6_u._8_8_ = __return_storage_ptr__;
  pcVar1 = inet_ntop(10,&local_20,ntop6::buf,0x2e);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,ntop6::buf,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::ntop6(in_addr6 ip) {
	static char buf[46];
	if (inet_ntop(AF_INET6, &ip, buf, sizeof(buf)) == nullptr) {
		return {};
	}
	return std::string(buf);
}